

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::doRemoveCols(SPxSolverBase<double> *this,int *perm)

{
  SPxStatus SVar1;
  
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<double>::doRemoveCols(&this->super_SPxLPBase<double>,perm);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  if ((this->super_SPxBasisBase<double>).thestatus < SINGULAR) {
    return;
  }
  SPxBasisBase<double>::removedCols(&this->super_SPxBasisBase<double>,perm);
  SVar1 = (this->super_SPxBasisBase<double>).thestatus;
  if (SVar1 != UNBOUNDED) {
    if (SVar1 == OPTIMAL) {
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->super_SPxBasisBase<double>).thestatus == DUAL) {
        return;
      }
      (this->super_SPxBasisBase<double>).thestatus = DUAL;
      return;
    }
    if (SVar1 != PRIMAL) {
      return;
    }
  }
  if (this->m_status == OPTIMAL) {
    this->m_status = UNKNOWN;
  }
  if ((this->super_SPxBasisBase<double>).thestatus != REGULAR) {
    (this->super_SPxBasisBase<double>).thestatus = REGULAR;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveCols(int perm[])
{
   forceRecompNonbasicValue();

   SPxLPBase<R>::doRemoveCols(perm);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedCols(perm);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::PRIMAL:
      case SPxBasisBase<R>::UNBOUNDED:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::DUAL);
         break;

      default:
         break;
      }
   }
}